

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O3

TransactionController * __thiscall
cfd::api::TransactionApi::CreateRawTransaction
          (TransactionController *__return_storage_ptr__,TransactionApi *this,uint32_t version,
          uint32_t locktime,vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *txins,
          vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txouts)

{
  CfdException *this_00;
  TransactionController *this_01;
  TransactionController txc;
  uint32_t local_9c;
  string local_98;
  undefined1 local_78 [16];
  _func_int *local_68 [8];
  
  local_9c = version;
  if (version < 5) {
    this_01 = (TransactionController *)local_78;
    TransactionController::TransactionController(this_01,version,locktime);
    AbstractTransactionController::GetHex_abi_cxx11_
              (&local_98,(AbstractTransactionController *)this_01);
    AddRawTransaction(__return_storage_ptr__,(TransactionApi *)this_01,&local_98,txins,txouts);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    local_78._0_8_ = &PTR__TransactionController_002b10f8;
    core::Transaction::~Transaction((Transaction *)local_68);
    return __return_storage_ptr__;
  }
  local_78._0_8_ = "cfdapi_transaction.cpp";
  local_78._8_4_ = 0x46;
  local_68[0] = (_func_int *)0x266472;
  core::logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
             "Failed to CreateRawTransaction. invalid version number: version={}",&local_9c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Invalid version number. We supports only 1, 2, 3, or 4:","");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_78);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

TransactionController TransactionApi::CreateRawTransaction(
    uint32_t version, uint32_t locktime, const std::vector<TxIn>& txins,
    const std::vector<TxOut>& txouts) const {
  if (4 < version) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateRawTransaction. invalid version number: version={}",  // NOLINT
        version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid version number. We supports only 1, 2, 3, or 4:");
  }

  TransactionController txc(version, locktime);
  return AddRawTransaction(txc.GetHex(), txins, txouts);
}